

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_server.h
# Opt level: O2

void __thiscall xLearn::KVStore::Initialize(KVStore *this,size_t server_num)

{
  ostream *poVar1;
  allocator local_4e;
  allocator local_4d;
  Logger local_4c;
  string local_48;
  string local_28;
  
  if (server_num != 0) {
    this->server_num_ = server_num;
    return;
  }
  local_4c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server.h"
             ,&local_4d);
  std::__cxx11::string::string((string *)&local_48,"Initialize",&local_4e);
  poVar1 = Logger::Start(ERR,&local_28,0x2d,&local_48);
  poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/distributed/parameter_server.h"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x2d);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"server_num");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"0");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  Logger::~Logger(&local_4c);
  abort();
}

Assistant:

virtual void Initialize(size_t server_num) {
   	 CHECK_GT(server_num, 0);
     server_num_ = server_num;
   }